

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBuildCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_cf23dc::TwoArgsSignature
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  cmExecutionStatus *this;
  bool bVar1;
  size_type sVar2;
  cmMakefile *this_00;
  const_reference name;
  ulong uVar3;
  cmGlobalGenerator *this_01;
  allocator<char> local_149;
  string local_148;
  undefined4 local_128;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  undefined1 local_b0 [8];
  string makecommand;
  string configType;
  cmValue cacheValue;
  string *define;
  cmMakefile *mf;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this = local_20;
  if (sVar2 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with less than two arguments",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    this_00 = cmExecutionStatus::GetMakefile(local_20);
    name = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,0);
    configType.field_2._8_8_ = cmMakefile::GetDefinition(this_00,name);
    std::__cxx11::string::string((string *)(makecommand.field_2._M_local_buf + 8));
    bVar1 = cmsys::SystemTools::GetEnv
                      ("CMAKE_CONFIG_TYPE",(string *)(makecommand.field_2._M_local_buf + 8));
    if ((!bVar1) || (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) != 0)) {
      std::__cxx11::string::operator=((string *)(makecommand.field_2._M_local_buf + 8),"Release");
    }
    this_01 = cmMakefile::GetGlobalGenerator(this_00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"",&local_d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,"",&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_120,"",&local_121);
    bVar1 = cmMakefile::IgnoreErrorsCMP0061(this_00);
    cmGlobalGenerator::GenerateCMakeBuildCommand
              ((string *)local_b0,this_01,&local_d0,(string *)((long)&makecommand.field_2 + 8),
               &local_f8,&local_120,bVar1);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator(&local_121);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    std::__cxx11::string::~string((string *)&local_d0);
    std::allocator<char>::~allocator(&local_d1);
    bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&configType.field_2 + 8));
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_148,"Command used to build entire project from the command line.",
                 &local_149);
      cmMakefile::AddCacheDefinition(this_00,name,(string *)local_b0,&local_148,STRING,false);
      std::__cxx11::string::~string((string *)&local_148);
      std::allocator<char>::~allocator(&local_149);
    }
    args_local._7_1_ = 1;
    local_128 = 1;
    std::__cxx11::string::~string((string *)local_b0);
    std::__cxx11::string::~string((string *)(makecommand.field_2._M_local_buf + 8));
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool TwoArgsSignature(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with less than two arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  std::string const& define = args[0];
  cmValue cacheValue = mf.GetDefinition(define);

  std::string configType;
  if (!cmSystemTools::GetEnv("CMAKE_CONFIG_TYPE", configType) ||
      configType.empty()) {
    configType = "Release";
  }

  std::string makecommand = mf.GetGlobalGenerator()->GenerateCMakeBuildCommand(
    "", configType, "", "", mf.IgnoreErrorsCMP0061());

  if (cacheValue) {
    return true;
  }
  mf.AddCacheDefinition(define, makecommand,
                        "Command used to build entire project "
                        "from the command line.",
                        cmStateEnums::STRING);
  return true;
}